

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

bool __thiscall
cmsys::SystemInformationImplementation::QueryProcessor(SystemInformationImplementation *this)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  if (0 < lVar1) {
    this->NumberOfPhysicalCPU = (uint)lVar1;
    this->NumberOfLogicalCPU = (uint)lVar1;
  }
  return 0 < lVar1;
}

Assistant:

bool SystemInformationImplementation::QueryProcessor()
{
  return this->QueryProcessorBySysconf();
}